

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  bool bVar1;
  reference __rhs;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_168;
  __normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_> local_160;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  allocator local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_59;
  string local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator it;
  string *fsPath_local;
  string *virtualFolderPath_local;
  cmXMLWriter *xml_local;
  Tree *this_local;
  
  it._M_current = fsPath;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->files);
  while( true ) {
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->files);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Unit",&local_59);
    cmXMLWriter::StartElement(xml,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::operator+(&local_d0,it._M_current,&this->path);
    std::operator+(&local_b0,&local_d0,"/");
    __rhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_30);
    std::operator+(&local_90,&local_b0,__rhs);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"Option",&local_f1);
    cmXMLWriter::StartElement(xml,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                   "CMake Files\\",virtualFolderPath);
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                   &this->path);
    std::operator+(&local_118,&local_138,"\\");
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"virtualFolder",&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&it_1);
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  local_160._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
  while( true ) {
    local_168._M_current = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
    bVar1 = __gnu_cxx::operator!=(&local_160,&local_168);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
              ::operator->(&local_160);
    std::operator+(&local_1a8,virtualFolderPath,&this->path);
    std::operator+(&local_188,&local_1a8,"\\");
    std::operator+(&local_1e8,it._M_current,&this->path);
    std::operator+(&local_1c8,&local_1e8,"/");
    BuildUnitImpl(this_00,xml,&local_188,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
    operator++(&local_160);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::vector<std::string>::const_iterator it = files.begin();
       it != files.end(); ++it) {
    xml.StartElement("Unit");
    xml.Attribute("filename", fsPath + path + "/" + *it);

    xml.StartElement("Option");
    xml.Attribute("virtualFolder",
                  "CMake Files\\" + virtualFolderPath + path + "\\");
    xml.EndElement();

    xml.EndElement();
  }
  for (std::vector<Tree>::const_iterator it = folders.begin();
       it != folders.end(); ++it) {
    it->BuildUnitImpl(xml, virtualFolderPath + path + "\\",
                      fsPath + path + "/");
  }
}